

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O1

weight * __thiscall sparse_parameters::operator[](sparse_parameters *this,size_t i)

{
  ulong uVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  __node_base_ptr p_Var4;
  __hash_code __code;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  
  p_Var5 = (_Hash_node_base *)(i & this->_weight_mask);
  uVar1 = (this->_map)._M_h._M_bucket_count;
  uVar2 = (ulong)p_Var5 % uVar1;
  p_Var3 = (this->_map)._M_h._M_buckets[uVar2];
  p_Var4 = (__node_base_ptr)0x0;
  if ((p_Var3 != (__node_base_ptr)0x0) &&
     (p_Var6 = p_Var3->_M_nxt, p_Var4 = p_Var3, p_Var5 != p_Var3->_M_nxt[1]._M_nxt)) {
    while (p_Var3 = p_Var6, p_Var6 = p_Var3->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      p_Var4 = (__node_base_ptr)0x0;
      if (((ulong)p_Var6[1]._M_nxt % uVar1 != uVar2) ||
         (p_Var4 = p_Var3, p_Var5 == p_Var6[1]._M_nxt)) goto LAB_0013e5c4;
    }
    p_Var4 = (__node_base_ptr)0x0;
  }
LAB_0013e5c4:
  if (p_Var4 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var4->_M_nxt;
  }
  if (p_Var6 == (_Hash_node_base *)0x0) {
    calloc_or_throw<float>(1L << ((byte)this->_stride_shift & 0x3f));
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_long,float*>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this);
    uVar1 = (this->_map)._M_h._M_bucket_count;
    uVar2 = (ulong)p_Var5 % uVar1;
    p_Var3 = (this->_map)._M_h._M_buckets[uVar2];
    p_Var4 = (__node_base_ptr)0x0;
    if ((p_Var3 != (__node_base_ptr)0x0) &&
       (p_Var6 = p_Var3->_M_nxt, p_Var4 = p_Var3, p_Var5 != p_Var3->_M_nxt[1]._M_nxt)) {
      while (p_Var3 = p_Var6, p_Var6 = p_Var3->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
        p_Var4 = (__node_base_ptr)0x0;
        if (((ulong)p_Var6[1]._M_nxt % uVar1 != uVar2) ||
           (p_Var4 = p_Var3, p_Var5 == p_Var6[1]._M_nxt)) goto LAB_0013e655;
      }
      p_Var4 = (__node_base_ptr)0x0;
    }
LAB_0013e655:
    if (p_Var4 == (__node_base_ptr)0x0) {
      p_Var6 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var6 = p_Var4->_M_nxt;
    }
    if (this->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
      (*this->fun)((weight *)p_Var6[2]._M_nxt,this->default_data);
    }
  }
  return (weight *)p_Var6[2]._M_nxt;
}

Assistant:

inline weight& operator[](size_t i)
  {
    uint64_t index = i & _weight_mask;
    weight_map::iterator iter = _map.find(index);
    if (iter == _map.end())
    {
      _map.insert(std::make_pair(index, calloc_mergable_or_throw<weight>(stride())));
      iter = _map.find(index);
      if (fun != nullptr)
        fun(iter->second, default_data);
    }
    return *(iter->second);
  }